

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dims_filter_initialize_dynamic_dims_array.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  array<unsigned_long,_3UL> local_68;
  array<unsigned_long,_3UL> local_48;
  
  if (boost::detail::report_errors_remind()::r == '\0') {
    main_cold_1();
  }
  local_48._M_elems[0] = 0;
  local_68._M_elems[0] = 0;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array (0, sz_array<1>{{0}}))","(sz_array<1>{{0}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x29,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  if (boost::detail::report_errors_remind()::r == '\0') {
    main_cold_2();
  }
  local_48._M_elems[0] = 3;
  local_68._M_elems[0] = 3;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array <dyn>(0, sz_array<1>{{0}}, 3))",
             "(sz_array<1>{{3}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x32,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  if (boost::detail::report_errors_remind()::r == '\0') {
    main_cold_3();
  }
  local_48._M_elems[0] = 3;
  local_68._M_elems[0] = 3;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, 5>(0, sz_array<1>{{0}}, 3, 5))",
             "(sz_array<1>{{3}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x3b,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  local_48._M_elems[0] = 5;
  local_68._M_elems[0] = 5;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array < 3, dyn>(0, sz_array<1>{{0}}, 3, 5))",
             "(sz_array<1>{{5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x3f,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  local_48._M_elems[0] = 3;
  local_48._M_elems[1] = 5;
  local_68._M_elems[0] = 3;
  local_68._M_elems[1] = 5;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5))",
             "(sz_array<2>{{3, 5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x43,"int main()",(array<unsigned_long,_2UL> *)&local_48,
             (array<unsigned_long,_2UL> *)&local_68);
  if (boost::detail::report_errors_remind()::r == '\0') {
    main_cold_4();
  }
  local_48._M_elems[0] = 3;
  local_68._M_elems[0] = 3;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, 5, 9>(0, sz_array<1>{{0}}, 3, 5, 9))",
             "(sz_array<1>{{3}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x4d,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  local_48._M_elems[0] = 5;
  local_68._M_elems[0] = 5;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array < 3, dyn, 9>(0, sz_array<1>{{0}}, 3, 5, 9))",
             "(sz_array<1>{{5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x51,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  local_48._M_elems[0] = 9;
  local_68._M_elems[0] = 9;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array < 3, 5, dyn>(0, sz_array<1>{{0}}, 3, 5, 9))",
             "(sz_array<1>{{9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x55,"int main()",(array<unsigned_long,_1UL> *)&local_48,
             (array<unsigned_long,_1UL> *)&local_68);
  local_48._M_elems[0] = 5;
  local_48._M_elems[1] = 9;
  local_68._M_elems[0] = 5;
  local_68._M_elems[1] = 9;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array < 3, dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))"
             ,"(sz_array<2>{{5, 9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x5a,"int main()",(array<unsigned_long,_2UL> *)&local_48,
             (array<unsigned_long,_2UL> *)&local_68);
  local_48._M_elems[0] = 3;
  local_48._M_elems[1] = 9;
  local_68._M_elems[0] = 3;
  local_68._M_elems[1] = 9;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, 5, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))"
             ,"(sz_array<2>{{3, 9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x5e,"int main()",(array<unsigned_long,_2UL> *)&local_48,
             (array<unsigned_long,_2UL> *)&local_68);
  local_48._M_elems[0] = 3;
  local_48._M_elems[1] = 5;
  local_68._M_elems[0] = 3;
  local_68._M_elems[1] = 5;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, dyn, 9>(0, sz_array<2>{{0, 0}}, 3, 5, 9))"
             ,"(sz_array<2>{{3, 5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x62,"int main()",(array<unsigned_long,_2UL> *)&local_48,
             (array<unsigned_long,_2UL> *)&local_68);
  local_48._M_elems[0] = 3;
  local_48._M_elems[1] = 5;
  local_48._M_elems[2] = 9;
  local_68._M_elems[0] = 3;
  local_68._M_elems[1] = 5;
  local_68._M_elems[2] = 9;
  boost::detail::test_eq_impl<std::array<unsigned_long,3ul>,std::array<unsigned_long,3ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, dyn, dyn>(0, sz_array<3>{{0, 0, 0}}, 3, 5, 9))"
             ,"(sz_array<3>{{3, 5, 9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x67,"int main()",&local_48,&local_68);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        (0, sz_array<0>{{ }}))
      , (sz_array<0>{{ }})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        (0, sz_array<1>{{0}}))
      , (sz_array<1>{{0}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3>(0, sz_array<0>{{ }}, 3))
      , (sz_array<0>{{ }})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn>(0, sz_array<1>{{0}}, 3))
      , (sz_array<1>{{3}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3,   5>(0, sz_array<0>{{ }}, 1, 2))
      , (sz_array<0>{{ }})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn,   5>(0, sz_array<1>{{0}}, 3, 5))
      , (sz_array<1>{{3}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3, dyn>(0, sz_array<1>{{0}}, 3, 5))
      , (sz_array<1>{{5}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5))
      , (sz_array<2>{{3, 5}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3,   5,   9>(0, sz_array<0>{{ }}, 3, 5, 9))
      , (sz_array<0>{{ }})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn,   5,   9>(0, sz_array<1>{{0}}, 3, 5, 9))
      , (sz_array<1>{{3}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3, dyn,   9>(0, sz_array<1>{{0}}, 3, 5, 9))
      , (sz_array<1>{{5}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3,   5, dyn>(0, sz_array<1>{{0}}, 3, 5, 9))
      , (sz_array<1>{{9}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3, dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))
      , (sz_array<2>{{5, 9}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn,   5, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))
      , (sz_array<2>{{3, 9}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn, dyn,   9>(0, sz_array<2>{{0, 0}}, 3, 5, 9))
      , (sz_array<2>{{3, 5}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn, dyn, dyn>(0, sz_array<3>{{0, 0, 0}}, 3, 5, 9))
      , (sz_array<3>{{3, 5, 9}})
    );

    return boost::report_errors();
}